

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_2,_2> deqp::gles3::Functional::MatrixCaseUtils::inverse<2>(Matrix<float,_2,_2> *mat)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  Matrix<float,_2,_2> *retVal;
  undefined1 (*in_RDI) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  Matrix<float,_2,_2> MVar9;
  
  fVar1 = (mat->m_data).m_data[0].m_data[0];
  fVar2 = (mat->m_data).m_data[1].m_data[1];
  uVar3 = *(undefined8 *)((mat->m_data).m_data[0].m_data + 1);
  fVar7 = -(float)uVar3;
  fVar6 = (float)((ulong)uVar3 >> 0x20);
  fVar8 = fVar1 * fVar2 + fVar6 * fVar7;
  MVar9.m_data.m_data[0].m_data[1] = 0.0;
  MVar9.m_data.m_data[0].m_data[0] = fVar1;
  auVar4._4_4_ = fVar7;
  auVar4._0_4_ = fVar2;
  auVar4._8_4_ = -fVar6;
  auVar4._12_4_ = fVar1;
  auVar5._4_4_ = fVar8;
  auVar5._0_4_ = fVar8;
  auVar5._8_4_ = fVar8;
  auVar5._12_4_ = fVar8;
  auVar5 = divps(auVar4,auVar5);
  *in_RDI = auVar5;
  MVar9.m_data.m_data[1].m_data = auVar5._0_8_;
  return (Matrix<float,_2,_2>)MVar9.m_data.m_data;
}

Assistant:

tcu::Matrix<float, 2, 2> inverse<2> (const tcu::Matrix<float, 2, 2>& mat)
{
	const float					det		= determinant(mat);
	tcu::Matrix<float, 2, 2>	retVal;

	DE_ASSERT(det != 0.0f);

	retVal(0, 0) =  mat(1, 1) / det;
	retVal(0, 1) = -mat(0, 1) / det;
	retVal(1, 0) = -mat(1, 0) / det;
	retVal(1, 1) =  mat(0, 0) / det;

	return retVal;
}